

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.h
# Opt level: O0

FieldSymbol * __thiscall
slang::ast::Scope::memberAt<slang::ast::FieldSymbol>(Scope *this,uint32_t index)

{
  FieldSymbol *pFVar1;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  sVar2;
  iter_difference_t<slang::ast::Scope::iterator> in_stack_ffffffffffffffc8;
  Scope *in_stack_ffffffffffffffe0;
  
  sVar2 = members(in_stack_ffffffffffffffe0);
  std::ranges::
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  ::begin((subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
           *)&stack0xffffffffffffffd0);
  std::ranges::__next_fn::operator()<slang::ast::Scope::iterator>
            ((__next_fn *)sVar2._M_begin.current.current,sVar2._M_end.current,
             in_stack_ffffffffffffffc8);
  iterator_facade<slang::ast::Scope::iterator,_false>::operator->
            ((iterator_facade<slang::ast::Scope::iterator,_false> *)0xa305c6);
  pFVar1 = Symbol::as<slang::ast::FieldSymbol>((Symbol *)0xa305ce);
  return pFVar1;
}

Assistant:

const T& memberAt(uint32_t index) const {
        return std::ranges::next(members().begin(), index)->as<T>();
    }